

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int *piVar2;
  Layer *pLVar3;
  undefined8 *puVar4;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  int num_input;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  ParamDict *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  Mat *in_stack_fffffffffffffb20;
  bool local_499;
  undefined8 *local_458;
  undefined8 *local_3e8;
  void *local_3a0;
  int *local_398;
  undefined4 local_388;
  long *local_380;
  undefined4 local_378;
  undefined4 local_36c;
  int local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  void *__ptr;
  Mat *in_stack_fffffffffffffcc0;
  Mat *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  void *local_300;
  int *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  long *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c0;
  void *local_2b8;
  int *local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  void *local_270;
  int *local_268;
  undefined8 local_260;
  undefined4 local_258;
  long *local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  undefined8 auStack_228 [2];
  ParamDict local_218;
  Layer *local_208;
  int local_1fc;
  long local_1f8;
  long *local_1f0;
  long local_1e8;
  int local_1d4;
  undefined8 *local_1d0;
  void **local_1c8;
  undefined8 *local_1b8;
  Option *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  Mat *in_stack_ffffffffffffff58;
  Option *in_stack_ffffffffffffff60;
  
  __ptr = (void *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8);
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x170) != 1)) {
    local_1f0 = in_RDX;
    if ((*(int *)(in_RSI + 0x28) == 1) &&
       (((*(int *)(in_RDI + 0xd4) == 1 && (*(int *)(in_RDI + 0xd8) == 1)) &&
        (local_1fc = *(int *)(in_RDI + 0x104) / *(int *)(in_RDI + 0xd0),
        *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x18) == local_1fc)))) {
      local_1f8 = in_RCX;
      local_1e8 = in_RSI;
      local_208 = create_layer(in_stack_fffffffffffffafc);
      ParamDict::ParamDict(in_stack_fffffffffffffb10);
      ParamDict::set(&local_218,0,*(int *)(in_RDI + 0xd0));
      ParamDict::set(&local_218,1,*(int *)(in_RDI + 0x100));
      ParamDict::set(&local_218,2,*(int *)(in_RDI + 0x104));
      ParamDict::set(&local_218,8,*(int *)(in_RDI + 0x108));
      ParamDict::set(&local_218,9,*(int *)(in_RDI + 0x10c));
      ParamDict::set((ParamDict *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                     in_stack_fffffffffffffb04,
                     (Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      (*local_208->_vptr_Layer[2])(local_208,&local_218);
      local_3e8 = (undefined8 *)&stack0xfffffffffffffcb8;
      do {
        local_1d0 = local_3e8;
        *local_3e8 = 0;
        local_3e8[1] = 0;
        local_3e8[2] = 0;
        *(undefined4 *)(local_3e8 + 3) = 0;
        local_3e8[4] = 0;
        *(undefined4 *)(local_3e8 + 5) = 0;
        *(undefined4 *)((long)local_3e8 + 0x2c) = 0;
        *(undefined4 *)(local_3e8 + 6) = 0;
        *(undefined4 *)((long)local_3e8 + 0x34) = 0;
        *(undefined4 *)(local_3e8 + 7) = 0;
        local_3e8[8] = 0;
        local_3e8 = local_3e8 + 9;
      } while (local_3e8 != auStack_228);
      if (&stack0xfffffffffffffcb8 != (undefined1 *)(in_RDI + 0x160)) {
        if (*(long *)(in_RDI + 0x168) != 0) {
          LOCK();
          **(int **)(in_RDI + 0x168) = **(int **)(in_RDI + 0x168) + 1;
          UNLOCK();
        }
        if (in_stack_fffffffffffffcc0 != (Mat *)0x0) {
          LOCK();
          iVar1 = *(int *)&in_stack_fffffffffffffcc0->data;
          *(int *)&in_stack_fffffffffffffcc0->data = *(int *)&in_stack_fffffffffffffcc0->data + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (in_stack_fffffffffffffcd8 == (Mat *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)((long)in_stack_fffffffffffffcd8->data + 0x18))
                        (in_stack_fffffffffffffcd8,__ptr);
            }
          }
        }
      }
      if (&local_300 != (void **)(in_RDI + 0x1a8)) {
        if (*(long *)(in_RDI + 0x1b0) != 0) {
          LOCK();
          **(int **)(in_RDI + 0x1b0) = **(int **)(in_RDI + 0x1b0) + 1;
          UNLOCK();
        }
        if (local_2f8 != (int *)0x0) {
          LOCK();
          iVar1 = *local_2f8;
          *local_2f8 = *local_2f8 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_2e0 == (long *)0x0) {
              if (local_300 != (void *)0x0) {
                free(local_300);
              }
            }
            else {
              (**(code **)(*local_2e0 + 0x18))(local_2e0,local_300);
            }
          }
        }
        local_300 = *(void **)(in_RDI + 0x1a8);
        local_2f8 = *(int **)(in_RDI + 0x1b0);
        local_2f0 = *(undefined8 *)(in_RDI + 0x1b8);
        local_2e8 = *(undefined4 *)(in_RDI + 0x1c0);
        local_2e0 = *(long **)(in_RDI + 0x1c8);
        local_2d8 = *(undefined4 *)(in_RDI + 0x1d0);
        local_2d4 = *(undefined4 *)(in_RDI + 0x1d4);
        local_2d0 = *(undefined4 *)(in_RDI + 0x1d8);
        local_2cc = *(undefined4 *)(in_RDI + 0x1dc);
        local_2c8 = *(undefined4 *)(in_RDI + 0x1e0);
        local_2c0 = *(undefined8 *)(in_RDI + 0x1e8);
      }
      if (*(int *)(in_RDI + 0x108) != 0) {
        if (&local_2b8 != (void **)(in_RDI + 0x1f0)) {
          if (*(long *)(in_RDI + 0x1f8) != 0) {
            LOCK();
            **(int **)(in_RDI + 0x1f8) = **(int **)(in_RDI + 0x1f8) + 1;
            UNLOCK();
          }
          if (local_2b0 != (int *)0x0) {
            LOCK();
            iVar1 = *local_2b0;
            *local_2b0 = *local_2b0 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (local_298 == (long *)0x0) {
                if (local_2b8 != (void *)0x0) {
                  free(local_2b8);
                }
              }
              else {
                (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
              }
            }
          }
          local_2b8 = *(void **)(in_RDI + 0x1f0);
          local_2b0 = *(int **)(in_RDI + 0x1f8);
          local_2a8 = *(undefined8 *)(in_RDI + 0x200);
          local_2a0 = *(undefined4 *)(in_RDI + 0x208);
          local_298 = *(long **)(in_RDI + 0x210);
          local_290 = *(undefined4 *)(in_RDI + 0x218);
          local_28c = *(undefined4 *)(in_RDI + 0x21c);
          local_288 = *(undefined4 *)(in_RDI + 0x220);
          local_284 = *(undefined4 *)(in_RDI + 0x224);
          local_280 = *(undefined4 *)(in_RDI + 0x228);
          local_278 = *(undefined8 *)(in_RDI + 0x230);
        }
        if (&local_270 != (void **)(in_RDI + 0x238)) {
          if (*(long *)(in_RDI + 0x240) != 0) {
            LOCK();
            **(int **)(in_RDI + 0x240) = **(int **)(in_RDI + 0x240) + 1;
            UNLOCK();
          }
          if (local_268 != (int *)0x0) {
            LOCK();
            iVar1 = *local_268;
            *local_268 = *local_268 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (local_250 == (long *)0x0) {
                if (local_270 != (void *)0x0) {
                  free(local_270);
                }
              }
              else {
                (**(code **)(*local_250 + 0x18))(local_250,local_270);
              }
            }
          }
          local_270 = *(void **)(in_RDI + 0x238);
          local_268 = *(int **)(in_RDI + 0x240);
          local_260 = *(undefined8 *)(in_RDI + 0x248);
          local_258 = *(undefined4 *)(in_RDI + 0x250);
          local_250 = *(long **)(in_RDI + 600);
          local_248 = *(undefined4 *)(in_RDI + 0x260);
          local_244 = *(undefined4 *)(in_RDI + 0x264);
          local_240 = *(undefined4 *)(in_RDI + 0x268);
          local_23c = *(undefined4 *)(in_RDI + 0x26c);
          local_238 = *(undefined4 *)(in_RDI + 0x270);
          local_230 = *(undefined8 *)(in_RDI + 0x278);
        }
      }
      pLVar3 = local_208;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffffb10,
                 (Mat *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_358);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      (*local_208->_vptr_Layer[4])(local_208,local_1f8);
      (*local_208->_vptr_Layer[7])(local_208,local_1e8,local_1f0,local_1f8);
      (*local_208->_vptr_Layer[5])(local_208,local_1f8);
      if (local_208 != (Layer *)0x0) {
        (*local_208->_vptr_Layer[1])();
      }
      local_1d4 = 0;
      local_458 = auStack_228;
      do {
        puVar4 = local_458 + -9;
        local_1b8 = puVar4;
        if (local_458[-8] != 0) {
          piVar2 = (int *)local_458[-8];
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_458[-5] == 0) {
              if ((void *)*puVar4 != (void *)0x0) {
                free((void *)*puVar4);
              }
            }
            else {
              (**(code **)(*(long *)local_458[-5] + 0x18))((long *)local_458[-5],*puVar4);
            }
          }
        }
        *puVar4 = 0;
        local_458[-7] = 0;
        *(undefined4 *)(local_458 + -6) = 0;
        *(undefined4 *)(local_458 + -4) = 0;
        *(undefined4 *)((long)local_458 + -0x1c) = 0;
        *(undefined4 *)(local_458 + -3) = 0;
        *(undefined4 *)((long)local_458 + -0x14) = 0;
        *(undefined4 *)(local_458 + -2) = 0;
        local_458[-1] = 0;
        local_458[-8] = 0;
        local_458 = puVar4;
      } while (puVar4 != (undefined8 *)&stack0xfffffffffffffcb8);
      ParamDict::~ParamDict
                ((ParamDict *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    }
    else {
      local_1c8 = &local_3a0;
      local_3a0 = (void *)0x0;
      local_398 = (int *)0x0;
      local_388 = 0;
      local_380 = (long *)0x0;
      local_378 = 0;
      local_36c = 0;
      local_368 = 0;
      local_360 = 0;
      make_padding((Convolution *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   (Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   (Mat *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                   (Option *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_499 = local_3a0 == (void *)0x0 || local_360 * local_368 == 0;
      if (local_499) {
        local_1d4 = -100;
      }
      else {
        Mat::create(in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                    (int)in_stack_fffffffffffffb18,(int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        bVar5 = true;
        if (*local_1f0 != 0) {
          bVar5 = local_1f0[8] * (long)(int)local_1f0[7] == 0;
        }
        if (bVar5) {
          local_1d4 = -100;
        }
        else {
          local_1d4 = convolution(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                  in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  (int)((ulong)__ptr >> 0x20),(int)__ptr,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
          if (local_1d4 == 0) {
            local_1d4 = 0;
          }
        }
      }
      if (local_398 != (int *)0x0) {
        LOCK();
        iVar1 = *local_398;
        *local_398 = *local_398 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_380 == (long *)0x0) {
            if (local_3a0 != (void *)0x0) {
              free(local_3a0);
            }
          }
          else {
            (**(code **)(*local_380 + 0x18))(local_380,local_3a0);
          }
        }
      }
    }
  }
  else {
    local_1d4 = forward_int8((Convolution *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             in_stack_fffffffffffffe50);
  }
  return local_1d4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w * bottom_blob.elempack == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);
            pd.set(9, activation_type);
            pd.set(10, activation_params);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

#if NCNN_INT8
            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = bottom_blob_int8_scales;
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            op->destroy_pipeline(opt);

            delete op;

            return 0;
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}